

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Expression * __thiscall wasm::Builder::makeConstantExpression(Builder *this,Literals *values)

{
  bool bVar1;
  size_t sVar2;
  Literal *pLVar3;
  value_type *pvVar4;
  Iterator IVar5;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar6;
  Literal local_c0;
  Expression *local_a8;
  undefined1 local_a0 [8];
  value_type value;
  Iterator __end3;
  Iterator __begin3;
  Literals *__range3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> consts;
  Literal local_38;
  Literals *local_20;
  Literals *values_local;
  Builder *this_local;
  
  local_20 = values;
  values_local = (Literals *)this;
  sVar2 = SmallVector<wasm::Literal,_1UL>::size((SmallVector<wasm::Literal,_1UL> *)values);
  if (sVar2 != 0) {
    sVar2 = SmallVector<wasm::Literal,_1UL>::size((SmallVector<wasm::Literal,_1UL> *)values);
    if (sVar2 == 1) {
      pLVar3 = SmallVector<wasm::Literal,_1UL>::operator[]
                         ((SmallVector<wasm::Literal,_1UL> *)values,0);
      wasm::Literal::Literal(&local_38,pLVar3);
      this_local = (Builder *)makeConstantExpression(this,&local_38);
      wasm::Literal::~Literal(&local_38);
    }
    else {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range3);
      IVar5 = SmallVector<wasm::Literal,_1UL>::begin((SmallVector<wasm::Literal,_1UL> *)values);
      __end3.
      super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
      .index = (size_t)IVar5.
                       super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                       .parent;
      IVar6 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
               )SmallVector<wasm::Literal,_1UL>::end((SmallVector<wasm::Literal,_1UL> *)values);
      while( true ) {
        __end3.
        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        .parent = (SmallVector<wasm::Literal,_1UL> *)IVar6.index;
        value.type.id = (uintptr_t)IVar6.parent;
        bVar1 = SmallVector<wasm::Literal,_1UL>::
                IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                              *)&__end3.
                                 super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                 .index,(Iterator *)&value.type);
        if (!bVar1) break;
        pvVar4 = SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                           ((Iterator *)
                            &__end3.
                             super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                             .index);
        wasm::Literal::Literal((Literal *)local_a0,pvVar4);
        wasm::Literal::Literal(&local_c0,(Literal *)local_a0);
        local_a8 = makeConstantExpression(this,&local_c0);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range3,
                   &local_a8);
        wasm::Literal::~Literal(&local_c0);
        wasm::Literal::~Literal((Literal *)local_a0);
        SmallVector<wasm::Literal,_1UL>::
        IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                      *)&__end3.
                         super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                         .index);
        IVar6.index = (size_t)__end3.
                              super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                              .parent;
        IVar6.parent = (SmallVector<wasm::Literal,_1UL> *)value.type.id;
      }
      this_local = (Builder *)
                   makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&>
                             (this,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)&__range3);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range3);
    }
    return (Expression *)this_local;
  }
  __assert_fail("values.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x512,"Expression *wasm::Builder::makeConstantExpression(Literals)");
}

Assistant:

Expression* makeConstantExpression(Literals values) {
    assert(values.size() > 0);
    if (values.size() == 1) {
      return makeConstantExpression(values[0]);
    } else {
      std::vector<Expression*> consts;
      for (auto value : values) {
        consts.push_back(makeConstantExpression(value));
      }
      return makeTupleMake(consts);
    }
  }